

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_decoder__on_seek_memory(ma_decoder *pDecoder,int byteOffset,ma_seek_origin origin)

{
  int local_14;
  ma_seek_origin origin_local;
  int byteOffset_local;
  ma_decoder *pDecoder_local;
  
  if (origin == ma_seek_origin_current) {
    local_14 = byteOffset;
    if (byteOffset < 1) {
      if ((pDecoder->backend).memory.currentReadPos < (ulong)(long)-byteOffset) {
        local_14 = -(int)(pDecoder->backend).memory.currentReadPos;
      }
    }
    else if ((pDecoder->backend).vfs.file <
             (ma_vfs_file)((pDecoder->backend).memory.currentReadPos + (long)byteOffset)) {
      local_14 = (int)(pDecoder->backend).memory.dataSize -
                 (int)(pDecoder->backend).memory.currentReadPos;
    }
    (pDecoder->backend).memory.currentReadPos =
         (long)local_14 + (pDecoder->backend).memory.currentReadPos;
  }
  else if ((pDecoder->backend).vfs.file < (ma_vfs_file)(ulong)(uint)byteOffset) {
    (pDecoder->backend).memory.currentReadPos = (size_t)(pDecoder->backend).vfs.file;
  }
  else {
    *(long *)((long)&pDecoder->backend + 0x10) = (long)byteOffset;
  }
  return 1;
}

Assistant:

static ma_bool32 ma_decoder__on_seek_memory(ma_decoder* pDecoder, int byteOffset, ma_seek_origin origin)
{
    if (origin == ma_seek_origin_current) {
        if (byteOffset > 0) {
            if (pDecoder->backend.memory.currentReadPos + byteOffset > pDecoder->backend.memory.dataSize) {
                byteOffset = (int)(pDecoder->backend.memory.dataSize - pDecoder->backend.memory.currentReadPos);  /* Trying to seek too far forward. */
            }
        } else {
            if (pDecoder->backend.memory.currentReadPos < (size_t)-byteOffset) {
                byteOffset = -(int)pDecoder->backend.memory.currentReadPos;  /* Trying to seek too far backwards. */
            }
        }

        /* This will never underflow thanks to the clamps above. */
        pDecoder->backend.memory.currentReadPos += byteOffset;
    } else {
        if ((ma_uint32)byteOffset <= pDecoder->backend.memory.dataSize) {
            pDecoder->backend.memory.currentReadPos = byteOffset;
        } else {
            pDecoder->backend.memory.currentReadPos = pDecoder->backend.memory.dataSize;  /* Trying to seek too far forward. */
        }
    }

    return MA_TRUE;
}